

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string *name,Symbol symbol)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  __buckets_ptr pp_Var4;
  __node_ptr p_Var5;
  _Hash_node_base *p_Var6;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var7;
  ulong uVar8;
  char cVar9;
  size_type __n;
  ulong uVar10;
  _Hash_node_base _Var11;
  _Hash_node_base *p_Var12;
  pointer __ptr_1;
  undefined1 auVar13 [16];
  __buckets_alloc_type __alloc;
  new_allocator<std::__detail::_Hash_node_base_*> local_59;
  size_t local_58;
  key_type local_50;
  Type local_40;
  undefined4 uStack_3c;
  anon_union_8_8_13f84498_for_Symbol_2 aStack_38;
  
  aStack_38 = symbol.field_1;
  local_50.second = (name->_M_dataplus)._M_p;
  local_40 = symbol.type;
  cVar9 = *(char *)&((_Hash_node_base *)local_50.second)->_M_nxt;
  if (cVar9 == '\0') {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    p_Var12 = (_Hash_node_base *)local_50.second;
    do {
      p_Var12 = (_Hash_node_base *)((long)&p_Var12->_M_nxt + 1);
      uVar8 = (long)cVar9 + uVar8 * 5;
      cVar9 = *(char *)p_Var12;
    } while (cVar9 != '\0');
  }
  p_Var12 = (_Hash_node_base *)((long)parent * 0x1000193 ^ uVar8);
  uVar8 = (ulong)p_Var12 % (this->symbols_by_parent_)._M_h._M_bucket_count;
  local_50.first = parent;
  p_Var5 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this,uVar8,&local_50,(__hash_code)p_Var12);
  if (p_Var5 == (__node_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)operator_new(0x30);
    p_Var6->_M_nxt = (_Hash_node_base *)0x0;
    p_Var6[1]._M_nxt = (_Hash_node_base *)local_50.first;
    p_Var6[2]._M_nxt = (_Hash_node_base *)local_50.second;
    p_Var6[3]._M_nxt = (_Hash_node_base *)CONCAT44(uStack_3c,local_40);
    *(anon_union_8_8_13f84498_for_Symbol_2 *)(p_Var6 + 4) = aStack_38;
    local_58 = (this->symbols_by_parent_)._M_h._M_rehash_policy._M_next_resize;
    auVar13 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->symbols_by_parent_)._M_h._M_rehash_policy,
                         (this->symbols_by_parent_)._M_h._M_bucket_count,
                         (this->symbols_by_parent_)._M_h._M_element_count);
    __n = auVar13._8_8_;
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(this->symbols_by_parent_)._M_h._M_single_bucket;
        (this->symbols_by_parent_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (&local_59,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var11._M_nxt = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var11._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(this->symbols_by_parent_)._M_h._M_before_begin;
        uVar8 = 0;
        do {
          p_Var3 = (_Var11._M_nxt)->_M_nxt;
          uVar10 = (ulong)_Var11._M_nxt[5]._M_nxt % __n;
          if (__s[uVar10] == (_Hash_node_base *)0x0) {
            (_Var11._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var11._M_nxt;
            __s[uVar10] = p_Var1;
            if ((_Var11._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var7 = __s + uVar8;
              goto LAB_002bd29a;
            }
          }
          else {
            (_Var11._M_nxt)->_M_nxt = __s[uVar10]->_M_nxt;
            pp_Var7 = &__s[uVar10]->_M_nxt;
            uVar10 = uVar8;
LAB_002bd29a:
            *pp_Var7 = _Var11._M_nxt;
          }
          _Var11._M_nxt = p_Var3;
          uVar8 = uVar10;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var4 = (this->symbols_by_parent_)._M_h._M_buckets;
      if (&(this->symbols_by_parent_)._M_h._M_single_bucket != pp_Var4) {
        operator_delete(pp_Var4);
      }
      (this->symbols_by_parent_)._M_h._M_bucket_count = __n;
      (this->symbols_by_parent_)._M_h._M_buckets = __s;
      uVar8 = (ulong)p_Var12 % __n;
    }
    p_Var6[5]._M_nxt = p_Var12;
    pp_Var4 = (this->symbols_by_parent_)._M_h._M_buckets;
    if (pp_Var4[uVar8] == (__node_base_ptr)0x0) {
      p_Var12 = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      p_Var6->_M_nxt = p_Var12;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = p_Var6;
      if (p_Var12 != (_Hash_node_base *)0x0) {
        pp_Var4[(ulong)p_Var12[5]._M_nxt % (this->symbols_by_parent_)._M_h._M_bucket_count] = p_Var6
        ;
      }
      (this->symbols_by_parent_)._M_h._M_buckets[uVar8] =
           &(this->symbols_by_parent_)._M_h._M_before_begin;
    }
    else {
      p_Var6->_M_nxt = pp_Var4[uVar8]->_M_nxt;
      pp_Var4[uVar8]->_M_nxt = p_Var6;
    }
    psVar2 = &(this->symbols_by_parent_)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
  }
  return p_Var5 == (__node_ptr)0x0;
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               const std::string& name,
                                               Symbol symbol) {
  PointerStringPair by_parent_key(parent, name.c_str());
  return InsertIfNotPresent(&symbols_by_parent_, by_parent_key, symbol);
}